

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void set_local_option(connectdata *conn,int option,int newstate)

{
  int iVar1;
  void *pvVar2;
  TELNET *tn;
  int newstate_local;
  int option_local;
  connectdata *conn_local;
  
  pvVar2 = (conn->data->req).protop;
  if (newstate == 1) {
    switch(*(undefined4 *)((long)pvVar2 + (long)option * 4 + 8)) {
    case 0:
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 8) = 2;
      send_negotiation(conn,0xfb,option);
      break;
    case 1:
      break;
    case 2:
      iVar1 = *(int *)((long)pvVar2 + (long)option * 4 + 0x408);
      if ((iVar1 != 0) && (iVar1 == 1)) {
        *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0x408) = 0;
      }
      break;
    case 3:
      if (*(int *)((long)pvVar2 + (long)option * 4 + 0x408) == 0) {
        *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0x408) = 1;
      }
    }
  }
  else {
    switch(*(undefined4 *)((long)pvVar2 + (long)option * 4 + 8)) {
    case 0:
      break;
    case 1:
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 8) = 3;
      send_negotiation(conn,0xfc,option);
      break;
    case 2:
      if (*(int *)((long)pvVar2 + (long)option * 4 + 0x408) == 0) {
        *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0x408) = 1;
      }
      break;
    case 3:
      iVar1 = *(int *)((long)pvVar2 + (long)option * 4 + 0x408);
      if ((iVar1 != 0) && (iVar1 == 1)) {
        *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0x408) = 0;
      }
    }
  }
  return;
}

Assistant:

static void
set_local_option(struct connectdata *conn, int option, int newstate)
{
  struct TELNET *tn = (struct TELNET *)conn->data->req.protop;
  if(newstate == CURL_YES) {
    switch(tn->us[option]) {
    case CURL_NO:
      tn->us[option] = CURL_WANTYES;
      send_negotiation(conn, CURL_WILL, option);
      break;

    case CURL_YES:
      /* Already enabled */
      break;

    case CURL_WANTNO:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        /* Already negotiating for CURL_YES, queue the request */
        tn->usq[option] = CURL_OPPOSITE;
        break;
      case CURL_OPPOSITE:
        /* Error: already queued an enable request */
        break;
      }
      break;

    case CURL_WANTYES:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        /* Error: already negotiating for enable */
        break;
      case CURL_OPPOSITE:
        tn->usq[option] = CURL_EMPTY;
        break;
      }
      break;
    }
  }
  else { /* NO */
    switch(tn->us[option]) {
    case CURL_NO:
      /* Already disabled */
      break;

    case CURL_YES:
      tn->us[option] = CURL_WANTNO;
      send_negotiation(conn, CURL_WONT, option);
      break;

    case CURL_WANTNO:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        /* Already negotiating for NO */
        break;
      case CURL_OPPOSITE:
        tn->usq[option] = CURL_EMPTY;
        break;
      }
      break;

    case CURL_WANTYES:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        tn->usq[option] = CURL_OPPOSITE;
        break;
      case CURL_OPPOSITE:
        break;
      }
      break;
    }
  }
}